

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseExportModuleField(WastParser *this,Module *module)

{
  bool bVar1;
  pointer pEVar2;
  unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> local_70;
  Enum local_64;
  Enum local_60;
  Enum local_5c;
  undefined4 local_58;
  Enum local_54;
  Location local_50;
  unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> local_30;
  unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> field;
  Module *module_local;
  WastParser *this_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>.
  super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl._4_4_ = Expect(this,Lpar);
  bVar1 = Failed(field._M_t.
                 super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
                 .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    GetLocation(&local_50,this);
    MakeUnique<wabt::ExportModuleField,wabt::Location>((wabt *)&local_30,&local_50);
    local_54 = (Enum)Expect(this,Export);
    bVar1 = Failed((Result)local_54);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      pEVar2 = std::
               unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>::
               operator->(&local_30);
      local_5c = (Enum)ParseQuotedText(this,&(pEVar2->export_).name);
      bVar1 = Failed((Result)local_5c);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        pEVar2 = std::
                 unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                 ::operator->(&local_30);
        local_60 = (Enum)ParseExportDesc(this,&pEVar2->export_);
        bVar1 = Failed((Result)local_60);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          local_64 = (Enum)Expect(this,Rpar);
          bVar1 = Failed((Result)local_64);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
          else {
            std::unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
            ::unique_ptr(&local_70,&local_30);
            Module::AppendField(module,&local_70);
            std::unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
            ::~unique_ptr(&local_70);
            Result::Result((Result *)((long)&this_local + 4),Ok);
          }
        }
      }
    }
    local_58 = 1;
    std::unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>::
    ~unique_ptr(&local_30);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseExportModuleField(Module* module) {
  WABT_TRACE(ParseExportModuleField);
  EXPECT(Lpar);
  auto field = MakeUnique<ExportModuleField>(GetLocation());
  EXPECT(Export);
  CHECK_RESULT(ParseQuotedText(&field->export_.name));
  CHECK_RESULT(ParseExportDesc(&field->export_));
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}